

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  reference piVar6;
  time_t tVar7;
  function<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>)>
  *this;
  undefined8 *in_RSI;
  int n;
  DynamicAssigner dynamic_assigner;
  RegularDecomposer<diy::Bounds<int>_> decomposer;
  Master master;
  time_t t;
  Bounds domain;
  ContiguousAssigner static_assigner;
  int nblocks;
  Options ops;
  bool help;
  double t0;
  double balance_time;
  double comp_time;
  double wall_time;
  float quantile;
  float sample_frac;
  int max_time;
  int iters;
  int bpr;
  communicator world;
  environment env;
  unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *in_stack_ffffffffffffe188;
  Master *in_stack_ffffffffffffe190;
  _func_void_void_ptr_BinaryBuffer_ptr **in_stack_ffffffffffffe198;
  NeverSkip *__f;
  Bounds<int> *in_stack_ffffffffffffe1a0;
  int in_stack_ffffffffffffe1b0;
  int in_stack_ffffffffffffe1b4;
  communicator *in_stack_ffffffffffffe1b8;
  DynamicAssigner *in_stack_ffffffffffffe1c0;
  Master *in_stack_ffffffffffffe1c8;
  Master *in_stack_ffffffffffffe1d0;
  DynamicAssigner *in_stack_ffffffffffffe1d8;
  Master *in_stack_ffffffffffffe1e0;
  undefined4 in_stack_ffffffffffffe1e8;
  int in_stack_ffffffffffffe1ec;
  string *in_stack_ffffffffffffe1f0;
  double *args_1;
  undefined4 in_stack_ffffffffffffe1f8;
  int in_stack_ffffffffffffe1fc;
  Master *in_stack_ffffffffffffe200;
  Master *master_00;
  undefined8 in_stack_ffffffffffffe208;
  FILE *f;
  undefined4 in_stack_ffffffffffffe210;
  undefined4 in_stack_ffffffffffffe214;
  undefined4 in_stack_ffffffffffffe220;
  undefined4 in_stack_ffffffffffffe224;
  DivisionsVector *divisions_;
  undefined1 local_1ca0 [40];
  int *local_1c78;
  int local_1c6c [19];
  undefined1 *local_1c20;
  DivisionsVector *local_1bf8;
  pointer ppLStack_1bf0;
  pointer local_1be8;
  undefined8 local_1bd8;
  _Manager_type p_Stack_1bd0;
  _Invoker_type local_1bc8;
  undefined8 local_1bb8;
  _Manager_type p_Stack_1bb0;
  DivisionsVector *local_1ba8;
  ExternalStorage *pEStack_1ba0;
  _Any_data local_1b98;
  _Manager_type local_1b88;
  _Invoker_type p_Stack_1b80;
  _Any_data local_1b78;
  _Manager_type local_1b68;
  code *local_1a48;
  NeverSkip local_1a40 [32];
  code *local_1a20;
  code *local_19f8;
  code *local_19d0;
  char **in_stack_ffffffffffffe650;
  int in_stack_ffffffffffffe65c;
  Options *in_stack_ffffffffffffe660;
  undefined1 local_1990 [1144];
  Creator *in_stack_ffffffffffffeae8;
  StaticAssigner *in_stack_ffffffffffffeaf0;
  int in_stack_ffffffffffffeafc;
  RegularDecomposer<diy::Bounds<int>_> *in_stack_ffffffffffffeb00;
  float in_stack_fffffffffffffc18;
  float in_stack_fffffffffffffc1c;
  _func_uint_Block_ptr_int **in_stack_fffffffffffffc20;
  DynamicAssigner *in_stack_fffffffffffffc28;
  Master *in_stack_fffffffffffffc30;
  int local_360;
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [47];
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [47];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [47];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [47];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [47];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [103];
  byte local_71;
  Master *local_70;
  double local_68;
  double local_60;
  FILE *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  int local_44;
  undefined4 local_40;
  communicator local_30;
  undefined8 *local_10;
  int local_4;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffe208 >> 0x20);
  local_4 = 0;
  local_10 = in_RSI;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe190,
             (int)((ulong)in_stack_ffffffffffffe188 >> 0x20),(char **)0x11062d);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffe190);
  local_40 = 4;
  local_44 = 1;
  local_48 = 1;
  local_4c = 0x3f000000;
  local_50 = 0x3f4ccccd;
  local_60 = 0.0;
  local_68 = 0.0;
  opts::Options::Options((Options *)in_stack_ffffffffffffe190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  opts::Option<bool>((char)((ulong)in_stack_ffffffffffffe1c8 >> 0x38),
                     (string *)in_stack_ffffffffffffe1c0,(bool *)in_stack_ffffffffffffe1b8,
                     (string *)CONCAT44(in_stack_ffffffffffffe1b4,in_stack_ffffffffffffe1b0));
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  opts::Option<int>((char)((uint)iVar3 >> 0x18),(string *)in_stack_ffffffffffffe200,
                    (int *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
                    in_stack_ffffffffffffe1f0);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  opts::Option<int>((char)((uint)iVar3 >> 0x18),(string *)in_stack_ffffffffffffe200,
                    (int *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
                    in_stack_ffffffffffffe1f0);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  opts::Option<int>((char)((uint)iVar3 >> 0x18),(string *)in_stack_ffffffffffffe200,
                    (int *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
                    in_stack_ffffffffffffe1f0);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  opts::Option<float>((char)((uint)iVar3 >> 0x18),(string *)in_stack_ffffffffffffe200,
                      (float *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
                      in_stack_ffffffffffffe1f0);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe1d0,(char *)in_stack_ffffffffffffe1c8,
             (allocator<char> *)in_stack_ffffffffffffe1c0);
  opts::Option<float>((char)((uint)iVar3 >> 0x18),(string *)in_stack_ffffffffffffe200,
                      (float *)CONCAT44(in_stack_ffffffffffffe1fc,in_stack_ffffffffffffe1f8),
                      in_stack_ffffffffffffe1f0);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe190,in_stack_ffffffffffffe188);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe190);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe190);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe190);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe190);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe190);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  bVar2 = opts::Options::parse
                    (in_stack_ffffffffffffe660,in_stack_ffffffffffffe65c,in_stack_ffffffffffffe650);
  if ((bVar2) && ((local_71 & 1) == 0)) {
    diy::mpi::communicator::size(&local_30);
    diy::mpi::communicator::size(&local_30);
    diy::ContiguousAssigner::Assigner
              ((ContiguousAssigner *)in_stack_ffffffffffffe190,
               (int)((ulong)in_stack_ffffffffffffe188 >> 0x20),(int)in_stack_ffffffffffffe188);
    diy::Bounds<int>::Bounds
              (in_stack_ffffffffffffe1a0,(int)((ulong)in_stack_ffffffffffffe198 >> 0x20));
    piVar6 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                        in_stack_ffffffffffffe190,(size_type)in_stack_ffffffffffffe188);
    *piVar6 = 0;
    piVar6 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                        in_stack_ffffffffffffe190,(size_type)in_stack_ffffffffffffe188);
    *piVar6 = 0;
    piVar6 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                        in_stack_ffffffffffffe190,(size_type)in_stack_ffffffffffffe188);
    *piVar6 = 0;
    piVar6 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                        in_stack_ffffffffffffe190,(size_type)in_stack_ffffffffffffe188);
    *piVar6 = 0xff;
    piVar6 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                        in_stack_ffffffffffffe190,(size_type)in_stack_ffffffffffffe188);
    *piVar6 = 0xff;
    piVar6 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
                        in_stack_ffffffffffffe190,(size_type)in_stack_ffffffffffffe188);
    *piVar6 = 0xff;
    iVar4 = diy::mpi::communicator::rank(&local_30);
    if (iVar4 == 0) {
      tVar7 = time((time_t *)0x0);
      local_360 = (int)tVar7;
    }
    diy::mpi::broadcast<long>
              ((communicator *)in_stack_ffffffffffffe190,(long *)in_stack_ffffffffffffe188,0);
    iVar4 = diy::mpi::communicator::rank(&local_30);
    srand(local_360 + iVar4);
    diy::mpi::communicator::communicator((communicator *)&stack0xffffffffffffe658,&local_30);
    local_19d0 = Block::create;
    std::function<void*()>::function<void*(*)(),void>
              ((function<void_*()> *)in_stack_ffffffffffffe1a0,
               (_func_void_ptr **)in_stack_ffffffffffffe198);
    local_19f8 = Block::destroy;
    std::function<void(void*)>::function<void(*)(void*),void>
              ((function<void_(void_*)> *)in_stack_ffffffffffffe1a0,
               (_func_void_void_ptr **)in_stack_ffffffffffffe198);
    local_1a20 = Block::save;
    std::function<void(void_const*,diy::BinaryBuffer&)>::
    function<void(*)(void_const*,diy::BinaryBuffer&),void>
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe1a0,
               in_stack_ffffffffffffe198);
    local_1a48 = Block::load;
    std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe1a0,
               in_stack_ffffffffffffe198);
    this = (function<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>)>
            *)operator_new(0x10);
    diy::Master::QueueSizePolicy::QueueSizePolicy
              ((QueueSizePolicy *)in_stack_ffffffffffffe190,(size_t)in_stack_ffffffffffffe188);
    __f = local_1a40;
    diy::Master::Master((Master *)master.mt_gen._M_x[0x54],(communicator *)master.mt_gen._M_x[0x53],
                        master.mt_gen._M_x[0x52]._4_4_,(int)master.mt_gen._M_x[0x52],
                        (CreateBlock *)master.mt_gen._M_x[0x51],
                        (DestroyBlock *)master.mt_gen._M_x[0x50],
                        (ExternalStorage *)master.mt_gen._M_x[0x56],
                        (SaveBlock *)master.mt_gen._M_x[0x57],(LoadBlock *)master.mt_gen._M_x[0x58],
                        (QueuePolicy *)master.mt_gen._M_x[0x59]);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x1114cc);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x1114d9);
    std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x1114e6);
    std::function<void_*()>::~function((function<void_*()> *)0x1114f3);
    diy::mpi::communicator::~communicator((communicator *)0x111500);
    divisions_ = (DivisionsVector *)0x0;
    local_1b78._M_unused._M_object = (void *)0x0;
    local_1b78._8_8_ = 0;
    local_1b88 = (_Manager_type)0x0;
    p_Stack_1b80 = (_Invoker_type)0x0;
    local_1b68 = (_Manager_type)0x0;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x11154a);
    pEStack_1ba0 = (ExternalStorage *)0x0;
    p_Stack_1bb0 = (_Manager_type)0x0;
    local_1b98._M_unused._M_object = (void *)0x0;
    local_1bb8 = divisions_;
    local_1ba8 = divisions_;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x111583);
    p_Stack_1bd0 = (_Manager_type)0x0;
    local_1bc8 = (_Invoker_type)0x0;
    local_1bd8 = divisions_;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1115b4);
    ppLStack_1bf0 = (pointer)0x0;
    local_1be8 = (pointer)0x0;
    in_stack_ffffffffffffe190 = (Master *)&local_1bf8;
    local_1bf8 = divisions_;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1115e5);
    diy::RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
              ((RegularDecomposer<diy::Bounds<int>_> *)
               CONCAT44(in_stack_ffffffffffffe214,in_stack_ffffffffffffe210),iVar3,
               (Bounds *)in_stack_ffffffffffffe200,in_stack_ffffffffffffe1fc,
               (BoolVector *)in_stack_ffffffffffffe1f0,
               (BoolVector *)CONCAT44(in_stack_ffffffffffffe1ec,in_stack_ffffffffffffe1e8),
               (CoordinateVector *)CONCAT44(in_stack_ffffffffffffe224,in_stack_ffffffffffffe220),
               divisions_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x111659);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x111666);
    diy::mpi::communicator::rank(&local_30);
    local_1c20 = local_1990;
    std::
    function<void(int,diy::Bounds<int>,diy::Bounds<int>,diy::Bounds<int>,diy::RegularLink<diy::Bounds<int>>)>
    ::function<main::__0,void>(this,(anon_class_8_1_60b11ba0 *)__f);
    diy::RegularDecomposer<diy::Bounds<int>_>::decompose
              (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeafc,in_stack_ffffffffffffeaf0,
               in_stack_ffffffffffffeae8);
    std::
    function<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>)>
    ::~function((function<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>)>
                 *)0x1116dc);
    iVar3 = diy::mpi::communicator::rank(&local_30);
    if (iVar3 == 0) {
      fmt::v7::print<char[32],,char>
                ((FILE *)in_stack_ffffffffffffe1d8,(char (*) [32])in_stack_ffffffffffffe1d0);
    }
    summary_stats(in_stack_ffffffffffffe200);
    diy::mpi::communicator::barrier((communicator *)0x111849);
    f = (FILE *)MPI_Wtime();
    local_58 = f;
    master_00 = (Master *)MPI_Wtime();
    local_70 = master_00;
    iVar3 = diy::mpi::communicator::size(&local_30);
    diy::DynamicAssigner::DynamicAssigner
              (in_stack_ffffffffffffe1c0,in_stack_ffffffffffffe1b8,in_stack_ffffffffffffe1b4,
               in_stack_ffffffffffffe1b0);
    diy::record_local_gids(in_stack_ffffffffffffe1e0,in_stack_ffffffffffffe1d8);
    diy::mpi::communicator::barrier((communicator *)0x1118e2);
    args_1 = (double *)MPI_Wtime();
    local_68 = local_68 + ((double)args_1 - (double)local_70);
    diy::mpi::communicator::barrier((communicator *)0x111927);
    for (local_1c6c[0] = 0; local_1c6c[0] < local_44; local_1c6c[0] = local_1c6c[0] + 1) {
      in_stack_ffffffffffffe1ec = diy::mpi::communicator::rank(&local_30);
      if (in_stack_ffffffffffffe1ec == 0) {
        fmt::v7::print<char[14],int&,char>
                  ((FILE *)in_stack_ffffffffffffe1d8,(char (*) [14])in_stack_ffffffffffffe1d0,
                   (int *)in_stack_ffffffffffffe1c8);
      }
      diy::mpi::communicator::barrier((communicator *)0x1119ac);
      local_70 = (Master *)MPI_Wtime();
      local_1ca0._32_8_ = &local_48;
      local_1c78 = local_1c6c;
      in_stack_ffffffffffffe1d8 = (DynamicAssigner *)local_1ca0;
      std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
                ((function<bool_(int,_const_diy::Master_&)> *)this,__f);
      diy::Master::foreach<main::__1>
                (in_stack_ffffffffffffe1d0,(anon_class_16_2_5c4db471 *)in_stack_ffffffffffffe1c8,
                 (Skip *)in_stack_ffffffffffffe1c0);
      std::function<bool_(int,_const_diy::Master_&)>::~function
                ((function<bool_(int,_const_diy::Master_&)> *)0x111a2d);
      diy::mpi::communicator::barrier((communicator *)0x111a3a);
      in_stack_ffffffffffffe1d0 = (Master *)MPI_Wtime();
      local_60 = local_60 + ((double)in_stack_ffffffffffffe1d0 - (double)local_70);
      in_stack_ffffffffffffe1c8 = (Master *)MPI_Wtime();
      local_70 = in_stack_ffffffffffffe1c8;
      diy::load_balance_sampling<unsigned_int(*)(Block*,int)>
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18);
      diy::mpi::communicator::barrier((communicator *)0x111adb);
      in_stack_ffffffffffffe1c0 = (DynamicAssigner *)MPI_Wtime();
      local_68 = ((double)in_stack_ffffffffffffe1c0 - (double)local_70) + local_68;
    }
    diy::mpi::communicator::barrier((communicator *)0x111b54);
    dVar1 = (double)MPI_Wtime();
    local_58 = (FILE *)(dVar1 - (double)local_58);
    iVar4 = diy::mpi::communicator::rank(&local_30);
    if ((iVar4 == 0) && (iVar4 = diy::mpi::communicator::rank(&local_30), iVar4 == 0)) {
      fmt::v7::print<char[86],double&,double&,double&,char>
                (f,(char (*) [86])master_00,(double *)CONCAT44(iVar3,in_stack_ffffffffffffe1f8),
                 args_1,(double *)CONCAT44(in_stack_ffffffffffffe1ec,in_stack_ffffffffffffe1e8));
    }
    iVar3 = diy::mpi::communicator::rank(&local_30);
    if (iVar3 == 0) {
      fmt::v7::print<char[31],,char>
                ((FILE *)in_stack_ffffffffffffe1d8,(char (*) [31])in_stack_ffffffffffffe1d0);
    }
    summary_stats(master_00);
    diy::DynamicAssigner::~DynamicAssigner((DynamicAssigner *)in_stack_ffffffffffffe190);
    diy::RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer
              ((RegularDecomposer<diy::Bounds<int>_> *)in_stack_ffffffffffffe190);
    diy::Master::~Master(in_stack_ffffffffffffe190);
    diy::Bounds<int>::~Bounds((Bounds<int> *)in_stack_ffffffffffffe190);
    diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x111c71);
  }
  else {
    iVar3 = diy::mpi::communicator::rank(&local_30);
    if (iVar3 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar5 = std::operator<<(poVar5,(char *)*local_10);
      std::operator<<(poVar5," [OPTIONS]\n");
      std::operator<<((ostream *)&std::cout,"Tests work stealing\n");
      opts::operator<<((ostream *)in_stack_ffffffffffffe1e0,(Options *)in_stack_ffffffffffffe1d8);
    }
    local_4 = 1;
  }
  opts::Options::~Options((Options *)in_stack_ffffffffffffe190);
  diy::mpi::communicator::~communicator((communicator *)0x111c96);
  diy::mpi::environment::~environment((environment *)0x111ca3);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);                          // diy equivalent of MPI_Init
    diy::mpi::communicator    world;                                    // diy equivalent of MPI communicator
    int                       bpr = 4;                                  // blocks per rank
    int                       iters = 1;                                // number of iterations to run
    int                       max_time = 1;                             // maximum time to compute a block (sec.)
    float                     sample_frac = 0.5f;                       // fraction of world procs to sample (0.0 - 1.0)
    float                     quantile = 0.8f;                          // quantile cutoff above which to move blocks (0.0 - 1.0)
    double                    wall_time;                                // wall clock execution time for entire code
    double                    comp_time = 0.0;                          // total computation time (sec.)
    double                    balance_time = 0.0;                       // total load balancing time (sec.)
    double                    t0;                                       // starting time (sec.)
    bool                      help;

    using namespace opts;
    Options ops;
    ops
        >> Option('h', "help",          help,           "show help")
        >> Option('b', "bpr",           bpr,            "number of diy blocks per mpi rank")
        >> Option('i', "iters",         iters,          "number of iterations")
        >> Option('t', "max_time",      max_time,       "maximum time to compute a block (in seconds)")
        >> Option('s', "sample_frac",   sample_frac,    "fraction of world procs to sample (0.0 - 1.0)")
        >> Option('q', "quantile",      quantile,       "quantile cutoff above which to move blocks (0.0 - 1.0)")
        ;

    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Tests work stealing\n";
            std::cout << ops;
        }
        return 1;
    }

//     diy::create_logger("trace");

    int                       nblocks = world.size() * bpr;             // total number of blocks in global domain
    diy::ContiguousAssigner   static_assigner(world.size(), nblocks);

    Bounds domain(3);                                                   // global data size
    domain.min[0] = domain.min[1] = domain.min[2] = 0;
    domain.max[0] = domain.max[1] = domain.max[2] = 255;

    // seed random number generator for user code, broadcast seed, offset by rank
    time_t t;
    if (world.rank() == 0)
        t = time(0);
    diy::mpi::broadcast(world, t, 0);
    srand(t + world.rank());

    // create master for managing blocks in this process
    diy::Master master(world,
                       1,                                               // one thread
                       -1,                                              // all blocks in memory
                       &Block::create,
                       &Block::destroy,
                       0,
                       &Block::save,
                       &Block::load);

    // create a regular decomposer and call its decompose function
    diy::RegularDecomposer<Bounds> decomposer(3,
                                              domain,
                                              nblocks);
    decomposer.decompose(world.rank(), static_assigner,
                         [&](int gid,                                   // block global id
                             const Bounds&,                             // core block bounds without any ghost added (unused)
                             const Bounds& bounds,                      // block bounds including ghost region
                             const Bounds&,                             // global domain bounds (unused)
                             const RGLink& link)                        // neighborhood
                         {
                             Block*     b   = new Block;
                             RGLink*    l   = new RGLink(link);
                             b->gid         = gid;

                             b->bounds      = bounds;
                             // TODO: comment out the following line for actual random work
                             // generation, leave uncommented for reproducible work generation
                             std::srand(gid + 1);

                             b->work        = static_cast<diy::Work>(double(std::rand()) / RAND_MAX * WORK_MAX);
                             master.add(gid, b, l);
                         });

    // collect summary stats before beginning
    if (world.rank() == 0)
        fmt::print(stderr, "Summary stats before beginning\n");
    summary_stats(master);

    // timing
    world.barrier();                                                    // barrier to synchronize clocks across procs, do not remove
    wall_time = MPI_Wtime();
    t0 = MPI_Wtime();

    // copy dynamic assigner from master
    diy::DynamicAssigner    dynamic_assigner(world, world.size(), nblocks);
    diy::record_local_gids(master, dynamic_assigner);

    // timing
    world.barrier();
    balance_time += (MPI_Wtime() - t0);

    // this barrier is mandatory, do not remove
    // dynamic assigner needs to be fully updated and sync'ed across all procs before proceeding
    world.barrier();

    // debug: print each block
//     master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
//             { b->show_block(cp); });

    // perform some iterative algorithm
    for (auto n = 0; n < iters; n++)
    {
        // debug
        if (world.rank() == 0)
            fmt::print(stderr, "iteration {}\n", n);

        // timing
        world.barrier();
        t0 = MPI_Wtime();

        // some block computation
        master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
                { b->compute(cp, max_time, n); });

        // timing
        world.barrier();
        comp_time += (MPI_Wtime() - t0);
        t0 = MPI_Wtime();

        // sampling load balancing method
        diy::load_balance_sampling(master, dynamic_assigner, &get_block_work, sample_frac, quantile);

        // timing
        world.barrier();
        balance_time += (MPI_Wtime() - t0);
    }

    // debug: print the master
//     for (auto i = 0; i < master.size(); i++)
//         fmt::print(stderr, "lid {} gid {}\n", i, master.gid(i));

    world.barrier();                                    // barrier to synchronize clocks over procs, do not remove
    wall_time = MPI_Wtime() - wall_time;
    if (world.rank() == 0)
    if (world.rank() == 0)
        fmt::print(stderr, "Total elapsed wall time {:.4} s = computation time {:.4} s + balancing time {:.4} s.\n",
                wall_time, comp_time, balance_time);

    // load balance summary stats
    if (world.rank() == 0)
        fmt::print(stderr, "Summary stats upon completion\n");
    summary_stats(master);
}